

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void __thiscall
CivetServer::addWebSocketHandler(CivetServer *this,string *uri,CivetWebSocketHandler *handler)

{
  mg_context *ctx;
  char *uri_00;
  CivetWebSocketHandler *handler_local;
  string *uri_local;
  CivetServer *this_local;
  
  ctx = this->context;
  uri_00 = (char *)std::__cxx11::string::c_str();
  mg_set_websocket_handler
            (ctx,uri_00,webSocketConnectionHandler,webSocketReadyHandler,webSocketDataHandler,
             webSocketCloseHandler,handler);
  return;
}

Assistant:

void
CivetServer::addWebSocketHandler(const std::string &uri,
                                 CivetWebSocketHandler *handler)
{
	mg_set_websocket_handler(context,
	                         uri.c_str(),
	                         webSocketConnectionHandler,
	                         webSocketReadyHandler,
	                         webSocketDataHandler,
	                         webSocketCloseHandler,
	                         handler);
}